

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall
cs::garbage_collector<cs::token_base>::collect(garbage_collector<cs::token_base> *this)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  set_t<cs::token_base_*> *__range2;
  iterator __begin0;
  iterator local_28;
  
  local_28 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
             ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
                      *)this);
  pcVar1 = (this->table).
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
           .ctrl_;
  sVar2 = (this->table).
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
          .capacity_;
  while (local_28.ctrl_ != pcVar1 + sVar2) {
    operator_delete(*local_28.field_1.slot_);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
    ::iterator::operator++(&local_28);
  }
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
  ::clear((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
           *)this);
  return;
}

Assistant:

void collect()
		{
			for (auto &ptr: table)
				::operator delete(ptr);
			table.clear();
		}